

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

bool __thiscall spv::Builder::containsPhysicalStorageBufferOrArray(Builder *this,Id typeId)

{
  bool bVar1;
  Op OVar2;
  StorageClass SVar3;
  int iVar4;
  Id IVar5;
  Instruction *this_00;
  int local_30;
  int m;
  Op typeClass;
  Instruction *instr;
  Id typeId_local;
  Builder *this_local;
  
  this_00 = Module::getInstruction(&this->module,typeId);
  OVar2 = spv::Instruction::getOpCode(this_00);
  if (OVar2 == OpTypeArray) {
    IVar5 = getContainedTypeId(this,typeId);
    this_local._7_1_ = containsPhysicalStorageBufferOrArray(this,IVar5);
  }
  else if (OVar2 == OpTypeStruct) {
    for (local_30 = 0; iVar4 = spv::Instruction::getNumOperands(this_00), local_30 < iVar4;
        local_30 = local_30 + 1) {
      IVar5 = spv::Instruction::getIdOperand(this_00,local_30);
      bVar1 = containsPhysicalStorageBufferOrArray(this,IVar5);
      if (bVar1) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else if (OVar2 == OpTypePointer) {
    SVar3 = getTypeStorageClass(this,typeId);
    this_local._7_1_ = SVar3 == PhysicalStorageBuffer;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Builder::containsPhysicalStorageBufferOrArray(Id typeId) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypePointer:
        return getTypeStorageClass(typeId) == StorageClassPhysicalStorageBufferEXT;
    case OpTypeArray:
        return containsPhysicalStorageBufferOrArray(getContainedTypeId(typeId));
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsPhysicalStorageBufferOrArray(instr.getIdOperand(m)))
                return true;
        }
        return false;
    default:
        return false;
    }
}